

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# CSkinnedMesh.cpp
# Opt level: O3

void __thiscall
irr::scene::CSkinnedMesh::skinJoint(CSkinnedMesh *this,SJoint *joint,SJoint *parentJoint)

{
  undefined1 *puVar1;
  float fVar2;
  float fVar3;
  float fVar4;
  float fVar5;
  float fVar6;
  float fVar7;
  float fVar8;
  float fVar9;
  float fVar10;
  float fVar11;
  undefined8 uVar12;
  array<irr::scene::SSkinMeshBuffer_*> *paVar13;
  char *pcVar14;
  SSkinMeshBuffer *pSVar15;
  undefined8 *puVar16;
  long lVar17;
  pointer ppSVar18;
  SJoint *extraout_RDX;
  ulong uVar19;
  long lVar20;
  pointer pSVar21;
  float fVar22;
  float fVar23;
  float fVar24;
  float fVar25;
  float fVar26;
  float fVar27;
  float fVar28;
  float fVar29;
  float fVar30;
  float fVar31;
  float fVar32;
  float fVar33;
  float fVar34;
  float fVar35;
  float fVar36;
  float fVar37;
  float fVar38;
  float fVar39;
  float fVar40;
  float fVar41;
  float fVar42;
  undefined1 auVar43 [16];
  undefined8 local_d8;
  undefined8 local_c8;
  float local_a8;
  float fStack_a4;
  
  if (((int)((ulong)((long)(joint->Weights).m_data.
                           super__Vector_base<irr::scene::ISkinnedMesh::SWeight,_std::allocator<irr::scene::ISkinnedMesh::SWeight>_>
                           ._M_impl.super__Vector_impl_data._M_finish -
                    (long)(joint->Weights).m_data.
                          super__Vector_base<irr::scene::ISkinnedMesh::SWeight,_std::allocator<irr::scene::ISkinnedMesh::SWeight>_>
                          ._M_impl.super__Vector_impl_data._M_start) >> 4) * -0x55555555 != 0) &&
     (pSVar21 = (joint->Weights).m_data.
                super__Vector_base<irr::scene::ISkinnedMesh::SWeight,_std::allocator<irr::scene::ISkinnedMesh::SWeight>_>
                ._M_impl.super__Vector_impl_data._M_start,
     (int)((ulong)((long)(joint->Weights).m_data.
                         super__Vector_base<irr::scene::ISkinnedMesh::SWeight,_std::allocator<irr::scene::ISkinnedMesh::SWeight>_>
                         ._M_impl.super__Vector_impl_data._M_finish - (long)pSVar21) >> 4) *
     -0x55555555 != 0)) {
    fVar2 = (joint->GlobalInversedMatrix).M[0];
    fVar3 = (joint->GlobalInversedMatrix).M[1];
    fVar4 = (joint->GlobalInversedMatrix).M[2];
    fVar5 = (joint->GlobalInversedMatrix).M[3];
    fVar6 = (joint->GlobalAnimatedMatrix).M[2];
    fVar7 = (joint->GlobalAnimatedMatrix).M[6];
    fVar8 = (joint->GlobalAnimatedMatrix).M[10];
    fVar9 = (joint->GlobalAnimatedMatrix).M[0xe];
    fVar32 = fVar9 * fVar5 + fVar8 * fVar4 + fVar6 * fVar2 + fVar3 * fVar7;
    fVar27 = (joint->GlobalInversedMatrix).M[4];
    fVar36 = (joint->GlobalInversedMatrix).M[5];
    fVar38 = (joint->GlobalInversedMatrix).M[6];
    fVar40 = (joint->GlobalInversedMatrix).M[7];
    fVar33 = fVar9 * fVar40 + fVar8 * fVar38 + fVar6 * fVar27 + fVar7 * fVar36;
    uVar12 = *(undefined8 *)((joint->GlobalAnimatedMatrix).M + 4);
    fVar24 = (float)uVar12;
    fVar25 = (float)((ulong)uVar12 >> 0x20);
    uVar12 = *(undefined8 *)(joint->GlobalAnimatedMatrix).M;
    fVar34 = (float)uVar12;
    fVar35 = (float)((ulong)uVar12 >> 0x20);
    uVar12 = *(undefined8 *)((joint->GlobalAnimatedMatrix).M + 8);
    fVar30 = (float)uVar12;
    fVar31 = (float)((ulong)uVar12 >> 0x20);
    uVar12 = *(undefined8 *)((joint->GlobalAnimatedMatrix).M + 0xc);
    fVar26 = (float)uVar12;
    fVar29 = (float)((ulong)uVar12 >> 0x20);
    fVar37 = fVar5 * fVar26 + fVar4 * fVar30 + fVar2 * fVar34 + fVar3 * fVar24;
    fVar39 = fVar5 * fVar29 + fVar4 * fVar31 + fVar2 * fVar35 + fVar25 * fVar3;
    fVar2 = (joint->GlobalInversedMatrix).M[8];
    fVar3 = (joint->GlobalInversedMatrix).M[9];
    fVar41 = fVar40 * fVar26 + fVar38 * fVar30 + fVar27 * fVar34 + fVar36 * fVar24;
    fVar42 = fVar40 * fVar29 + fVar38 * fVar31 + fVar27 * fVar35 + fVar36 * fVar25;
    fVar4 = (joint->GlobalInversedMatrix).M[10];
    fVar5 = (joint->GlobalInversedMatrix).M[0xb];
    fVar38 = fVar5 * fVar26 + fVar4 * fVar30 + fVar2 * fVar34 + fVar3 * fVar24;
    fVar40 = fVar5 * fVar29 + fVar4 * fVar31 + fVar2 * fVar35 + fVar3 * fVar25;
    fVar36 = fVar6 * fVar2 + fVar7 * fVar3 + fVar8 * fVar4 + fVar9 * fVar5;
    fVar2 = (joint->GlobalInversedMatrix).M[0xd];
    fVar3 = (joint->GlobalInversedMatrix).M[0xc];
    fVar4 = (joint->GlobalInversedMatrix).M[0xe];
    fVar5 = (joint->GlobalInversedMatrix).M[0xf];
    paVar13 = this->SkinningBuffers;
    local_a8 = 0.0;
    fStack_a4 = 0.0;
    fVar27 = 0.0;
    lVar20 = 0;
    uVar19 = 0;
    do {
      if (this->AnimateNormals == true) {
        fVar27 = *(float *)((long)&(pSVar21->StaticNormal).X + lVar20);
        fVar28 = *(float *)((long)&(pSVar21->StaticNormal).Y + lVar20);
        fVar10 = *(float *)((long)&(pSVar21->StaticNormal).Z + lVar20);
        local_a8 = fVar10 * fVar38 + fVar27 * fVar37 + fVar28 * fVar41;
        fStack_a4 = fVar10 * fVar40 + fVar27 * fVar39 + fVar28 * fVar42;
        fVar27 = fVar10 * fVar36 + fVar27 * fVar32 + fVar33 * fVar28;
      }
      fVar28 = *(float *)((long)&(pSVar21->StaticPos).X + lVar20);
      fVar10 = *(float *)((long)&(pSVar21->StaticPos).Y + lVar20);
      fVar11 = *(float *)((long)&(pSVar21->StaticPos).Z + lVar20);
      fVar22 = fVar11 * fVar38 + fVar28 * fVar37 + fVar10 * fVar41 +
               fVar5 * fVar26 + fVar4 * fVar30 + fVar3 * fVar34 + fVar2 * fVar24;
      fVar23 = fVar11 * fVar40 + fVar28 * fVar39 + fVar10 * fVar42 +
               fVar5 * fVar29 + fVar4 * fVar31 + fVar3 * fVar35 + fVar2 * fVar25;
      fVar28 = fVar11 * fVar36 + fVar28 * fVar32 + fVar33 * fVar10 +
               fVar6 * fVar3 + fVar7 * fVar2 + fVar8 * fVar4 + fVar9 * fVar5;
      pcVar14 = *(char **)((long)&pSVar21->Moved + lVar20);
      if (*pcVar14 == '\0') {
        *pcVar14 = '\x01';
        fVar10 = *(float *)((long)&pSVar21->strength + lVar20);
        local_d8 = CONCAT44(fVar23 * fVar10,fVar22 * fVar10);
        pSVar15 = (paVar13->m_data).
                  super__Vector_base<irr::scene::SSkinMeshBuffer_*,_std::allocator<irr::scene::SSkinMeshBuffer_*>_>
                  ._M_impl.super__Vector_impl_data._M_start
                  [*(ushort *)((long)&pSVar21->buffer_id + lVar20)];
        auVar43 = (**(code **)((long)(pSVar15->super_IMeshBuffer)._vptr_IMeshBuffer + 0x108))
                            (pSVar15,*(undefined4 *)((long)&pSVar21->vertex_id + lVar20));
        parentJoint = auVar43._8_8_;
        *auVar43._0_8_ = local_d8;
        *(float *)(auVar43._0_8_ + 1) = fVar28 * fVar10;
        if (this->AnimateNormals == true) {
          fVar28 = *(float *)((long)&pSVar21->strength + lVar20);
          local_c8 = CONCAT44(fVar28 * fStack_a4,fVar28 * local_a8);
          fVar28 = fVar28 * fVar27;
          pSVar15 = (paVar13->m_data).
                    super__Vector_base<irr::scene::SSkinMeshBuffer_*,_std::allocator<irr::scene::SSkinMeshBuffer_*>_>
                    ._M_impl.super__Vector_impl_data._M_start
                    [*(ushort *)((long)&pSVar21->buffer_id + lVar20)];
          auVar43 = (**(code **)((long)(pSVar15->super_IMeshBuffer)._vptr_IMeshBuffer + 0x108))
                              (pSVar15,*(undefined4 *)((long)&pSVar21->vertex_id + lVar20));
          *(undefined8 *)(auVar43._0_8_ + 0xc) = local_c8;
          goto LAB_001a164d;
        }
      }
      else {
        fVar10 = *(float *)((long)&pSVar21->strength + lVar20);
        pSVar15 = (paVar13->m_data).
                  super__Vector_base<irr::scene::SSkinMeshBuffer_*,_std::allocator<irr::scene::SSkinMeshBuffer_*>_>
                  ._M_impl.super__Vector_impl_data._M_start
                  [*(ushort *)((long)&pSVar21->buffer_id + lVar20)];
        auVar43 = (**(code **)((long)(pSVar15->super_IMeshBuffer)._vptr_IMeshBuffer + 0x108))
                            (pSVar15,*(undefined4 *)((long)&pSVar21->vertex_id + lVar20));
        parentJoint = auVar43._8_8_;
        puVar16 = auVar43._0_8_;
        *puVar16 = CONCAT44((float)((ulong)*puVar16 >> 0x20) + fVar23 * fVar10,
                            (float)*puVar16 + fVar22 * fVar10);
        *(float *)(puVar16 + 1) = fVar28 * fVar10 + *(float *)(puVar16 + 1);
        if (this->AnimateNormals == true) {
          fVar28 = *(float *)((long)&pSVar21->strength + lVar20);
          pSVar15 = (paVar13->m_data).
                    super__Vector_base<irr::scene::SSkinMeshBuffer_*,_std::allocator<irr::scene::SSkinMeshBuffer_*>_>
                    ._M_impl.super__Vector_impl_data._M_start
                    [*(ushort *)((long)&pSVar21->buffer_id + lVar20)];
          auVar43 = (**(code **)((long)(pSVar15->super_IMeshBuffer)._vptr_IMeshBuffer + 0x108))
                              (pSVar15,*(undefined4 *)((long)&pSVar21->vertex_id + lVar20));
          lVar17 = auVar43._0_8_;
          *(ulong *)(lVar17 + 0xc) =
               CONCAT44((float)((ulong)*(undefined8 *)(lVar17 + 0xc) >> 0x20) + fVar28 * fStack_a4,
                        (float)*(undefined8 *)(lVar17 + 0xc) + fVar28 * local_a8);
          fVar28 = fVar27 * fVar28 + *(float *)(lVar17 + 0x14);
LAB_001a164d:
          parentJoint = auVar43._8_8_;
          *(float *)(auVar43._0_8_ + 0x14) = fVar28;
        }
      }
      puVar1 = &(paVar13->m_data).
                super__Vector_base<irr::scene::SSkinMeshBuffer_*,_std::allocator<irr::scene::SSkinMeshBuffer_*>_>
                ._M_impl.super__Vector_impl_data._M_start
                [*(ushort *)((long)&pSVar21->buffer_id + lVar20)]->field_0x1b8;
      *puVar1 = *puVar1 | 1;
      uVar19 = uVar19 + 1;
      pSVar21 = (joint->Weights).m_data.
                super__Vector_base<irr::scene::ISkinnedMesh::SWeight,_std::allocator<irr::scene::ISkinnedMesh::SWeight>_>
                ._M_impl.super__Vector_impl_data._M_start;
      lVar20 = lVar20 + 0x30;
    } while (uVar19 < (uint)((int)((ulong)((long)(joint->Weights).m_data.
                                                 super__Vector_base<irr::scene::ISkinnedMesh::SWeight,_std::allocator<irr::scene::ISkinnedMesh::SWeight>_>
                                                 ._M_impl.super__Vector_impl_data._M_finish -
                                          (long)pSVar21) >> 4) * -0x55555555));
  }
  ppSVar18 = (joint->Children).m_data.
             super__Vector_base<irr::scene::ISkinnedMesh::SJoint_*,_std::allocator<irr::scene::ISkinnedMesh::SJoint_*>_>
             ._M_impl.super__Vector_impl_data._M_start;
  if ((int)((ulong)((long)(joint->Children).m_data.
                          super__Vector_base<irr::scene::ISkinnedMesh::SJoint_*,_std::allocator<irr::scene::ISkinnedMesh::SJoint_*>_>
                          ._M_impl.super__Vector_impl_data._M_finish - (long)ppSVar18) >> 3) != 0) {
    uVar19 = 0;
    do {
      skinJoint(this,ppSVar18[uVar19],parentJoint);
      uVar19 = uVar19 + 1;
      ppSVar18 = (joint->Children).m_data.
                 super__Vector_base<irr::scene::ISkinnedMesh::SJoint_*,_std::allocator<irr::scene::ISkinnedMesh::SJoint_*>_>
                 ._M_impl.super__Vector_impl_data._M_start;
      parentJoint = extraout_RDX;
    } while (uVar19 < ((ulong)((long)(joint->Children).m_data.
                                     super__Vector_base<irr::scene::ISkinnedMesh::SJoint_*,_std::allocator<irr::scene::ISkinnedMesh::SJoint_*>_>
                                     ._M_impl.super__Vector_impl_data._M_finish - (long)ppSVar18) >>
                       3 & 0xffffffff));
  }
  return;
}

Assistant:

void CSkinnedMesh::skinJoint(SJoint *joint, SJoint *parentJoint)
{
	if (joint->Weights.size()) {
		// Find this joints pull on vertices...
		core::matrix4 jointVertexPull(core::matrix4::EM4CONST_NOTHING);
		jointVertexPull.setbyproduct(joint->GlobalAnimatedMatrix, joint->GlobalInversedMatrix);

		core::vector3df thisVertexMove, thisNormalMove;

		core::array<scene::SSkinMeshBuffer *> &buffersUsed = *SkinningBuffers;

		// Skin Vertices Positions and Normals...
		for (u32 i = 0; i < joint->Weights.size(); ++i) {
			SWeight &weight = joint->Weights[i];

			// Pull this vertex...
			jointVertexPull.transformVect(thisVertexMove, weight.StaticPos);

			if (AnimateNormals)
				jointVertexPull.rotateVect(thisNormalMove, weight.StaticNormal);

			if (!(*(weight.Moved))) {
				*(weight.Moved) = true;

				buffersUsed[weight.buffer_id]->getVertex(weight.vertex_id)->Pos = thisVertexMove * weight.strength;

				if (AnimateNormals)
					buffersUsed[weight.buffer_id]->getVertex(weight.vertex_id)->Normal = thisNormalMove * weight.strength;

				//*(weight._Pos) = thisVertexMove * weight.strength;
			} else {
				buffersUsed[weight.buffer_id]->getVertex(weight.vertex_id)->Pos += thisVertexMove * weight.strength;

				if (AnimateNormals)
					buffersUsed[weight.buffer_id]->getVertex(weight.vertex_id)->Normal += thisNormalMove * weight.strength;

				//*(weight._Pos) += thisVertexMove * weight.strength;
			}

			buffersUsed[weight.buffer_id]->boundingBoxNeedsRecalculated();
		}
	}

	// Skin all children
	for (u32 j = 0; j < joint->Children.size(); ++j)
		skinJoint(joint->Children[j], joint);
}